

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# FunctionBody.cpp
# Opt level: O3

LPCWSTR __thiscall
Js::DeferDeserializeFunctionInfo::GetSourceInfo
          (DeferDeserializeFunctionInfo *this,int *lineNumber,int *columnNumber)

{
  SRCINFO *pSVar1;
  SourceContextInfo *pSVar2;
  char16 *pcVar3;
  uint uVar4;
  uint local_3c;
  int local_38;
  int lineNumberField;
  int columnNumberField;
  bool m_isEval;
  bool m_isDynamicFunction;
  
  ByteCodeSerializer::ReadSourceInfo
            (this,(int *)&local_3c,&local_38,(bool *)((long)&lineNumberField + 2),
             (bool *)((long)&lineNumberField + 3));
  pSVar1 = (((this->super_FunctionProxy).m_utf8SourceInfo.ptr)->m_srcInfo).ptr;
  uVar4 = pSVar1->lnMinHost;
  if (local_3c < pSVar1->lnMinHost) {
    uVar4 = 0;
  }
  *lineNumber = ((pSVar1->dlnHost + local_3c) - uVar4) + 1;
  uVar4 = pSVar1->lnMinHost;
  if (local_3c < uVar4) {
    uVar4 = 0;
  }
  if (uVar4 == local_3c) {
    local_38 = local_38 + pSVar1->ulColumnHost;
  }
  *columnNumber = local_38 + 1;
  pSVar2 = (pSVar1->sourceContextInfo).ptr;
  if ((pSVar2->dwHostSourceContext == 0xffffffffffffffff) ||
     ((pSVar2->isHostDynamicDocument & 1U) != 0)) {
    if (lineNumberField._3_1_ == '\0') {
      pcVar3 = L"Unknown script code";
    }
    else {
      pcVar3 = L"Function code";
    }
    if (lineNumberField._2_1_ != '\0') {
      pcVar3 = L"eval code";
    }
  }
  else {
    pcVar3 = (pSVar2->field_5).field_0.url;
  }
  return pcVar3;
}

Assistant:

LPCWSTR DeferDeserializeFunctionInfo::GetSourceInfo(int& lineNumber, int& columnNumber) const
    {
        // Read all the necessary information from the serialized byte code
        int lineNumberField, columnNumberField;
        bool m_isEval, m_isDynamicFunction;
        ByteCodeSerializer::ReadSourceInfo(this, lineNumberField, columnNumberField, m_isEval, m_isDynamicFunction);

        // Decode them
        lineNumber = ComputeAbsoluteLineNumber(lineNumberField);
        columnNumber = ComputeAbsoluteColumnNumber(lineNumberField, columnNumberField);
        return Js::ParseableFunctionInfo::GetSourceName<SourceContextInfo*>(this->GetSourceContextInfo(), m_isEval, m_isDynamicFunction);
    }